

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.hpp
# Opt level: O3

shared_ptr<libtorrent::dht::put_data_observer> __thiscall
libtorrent::dht::rpc_manager::
allocate_observer<libtorrent::dht::put_data_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,libtorrent::digest32<160l>const&,std::__cxx11::string_const&>
          (rpc_manager *this,shared_ptr<libtorrent::dht::traversal_algorithm> *args,
          basic_endpoint<boost::asio::ip::udp> *args_1,digest32<160L> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  put_data_observer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long *in_R9;
  shared_ptr<libtorrent::dht::put_data_observer> sVar2;
  shared_ptr<libtorrent::dht::traversal_algorithm> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  local_58 = args_3;
  this_00 = (put_data_observer *)allocate_observer((rpc_manager *)args);
  if (this_00 == (put_data_observer *)0x0) {
    (this->m_pool_allocator).super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
    (this->m_pool_allocator).list.ptr = (char *)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    local_68.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = *(undefined4 *)&(args_1->impl_).data_;
    local_68.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._4_4_ = (args_1->impl_).data_.v4.sin_addr.s_addr;
    local_68.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = *(undefined4 *)((long)&(args_1->impl_).data_ + 8);
    local_68.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = *(undefined4 *)((long)&(args_1->impl_).data_ + 0xc);
    *(undefined8 *)((long)&(args_1->impl_).data_ + 8) = 0;
    *(undefined8 *)&(args_1->impl_).data_ = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,*in_R9,in_R9[1] + *in_R9);
    put_data_observer::put_data_observer
              (this_00,&local_68,(endpoint *)args_2,(node_id *)local_58,&local_50);
    ::std::__shared_ptr<libtorrent::dht::put_data_observer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::dht::put_data_observer,libtorrent::dht::rpc_manager::allocate_observer<libtorrent::dht::put_data_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,libtorrent::digest32<160l>const&,std::__cxx11::string_const&>(std::shared_ptr<libtorrent::dht::traversal_algorithm>&&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&&,libtorrent::digest32<160l>const&,std::__cxx11::string_const&)::_lambda(libtorrent::dht::observer*)_1_,void>
              ((__shared_ptr<libtorrent::dht::put_data_observer,(__gnu_cxx::_Lock_policy)2> *)this,
               this_00,(anon_class_8_1_8991fb9c_for__M_tp)args);
    _Var1._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      _Var1._M_pi = extraout_RDX_01;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_68.
                 super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi._4_4_,
                 local_68.
                 super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_68.
                          super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_,
                          local_68.
                          super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_4_));
      _Var1._M_pi = extraout_RDX_02;
    }
  }
  sVar2.super___shared_ptr<libtorrent::dht::put_data_observer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<libtorrent::dht::put_data_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::dht::put_data_observer>)
         sVar2.super___shared_ptr<libtorrent::dht::put_data_observer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> allocate_observer(Args&&... args)
	{
		void* ptr = allocate_observer();
		if (ptr == nullptr) return std::shared_ptr<T>();

		auto deleter = [this](observer* o)
		{
			TORRENT_ASSERT(o->m_in_use);
			o->~observer();
			free_observer(o);
		};
		return std::shared_ptr<T>(new (ptr) T(std::forward<Args>(args)...), deleter);
	}